

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getnameinfo.c
# Opt level: O0

void uv__getnameinfo_work(uv__work *w)

{
  int iVar1;
  socklen_t local_20;
  socklen_t salen;
  int err;
  uv_getnameinfo_t *req;
  uv__work *w_local;
  
  if (*(short *)&w[1].done == 2) {
    local_20 = 0x10;
  }
  else {
    if (*(short *)&w[1].done != 10) {
      abort();
    }
    local_20 = 0x1c;
  }
  iVar1 = getnameinfo((sockaddr *)&w[1].done,local_20,(char *)((long)&w[4].loop + 4),0x401,
                      (char *)((long)&w[0x1e].work + 5),0x20,*(uint *)&w[4].loop);
  iVar1 = uv__getaddrinfo_translate_error(iVar1);
  *(int *)&w[0x1f].work = iVar1;
  return;
}

Assistant:

static void uv__getnameinfo_work(struct uv__work* w) {
  uv_getnameinfo_t* req;
  int err;
  socklen_t salen;

  req = container_of(w, uv_getnameinfo_t, work_req);

  if (req->storage.ss_family == AF_INET)
    salen = sizeof(struct sockaddr_in);
  else if (req->storage.ss_family == AF_INET6)
    salen = sizeof(struct sockaddr_in6);
  else
    abort();

  err = getnameinfo((struct sockaddr*) &req->storage,
                    salen,
                    req->host,
                    sizeof(req->host),
                    req->service,
                    sizeof(req->service),
                    req->flags);
  req->retcode = uv__getaddrinfo_translate_error(err);
}